

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

int SetUnion(char *s1,char *s2)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (long)size;
  if (0 < lVar2) {
    lVar3 = 0;
    iVar1 = 0;
    do {
      if ((s2[lVar3] != '\0') && (s1[lVar3] == '\0')) {
        s1[lVar3] = '\x01';
        iVar1 = 1;
      }
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
    return iVar1;
  }
  return 0;
}

Assistant:

int SetUnion(char *s1, char *s2)
{
  int i, progress;
  progress = 0;
  for(i=0; i<size; i++){
    if( s2[i]==0 ) continue;
    if( s1[i]==0 ){
      progress = 1;
      s1[i] = 1;
    }
  }
  return progress;
}